

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O0

void Cipher::printDecoded(TClusters *t,TClusterToLetterMap *clMap,THint *hint)

{
  TLetter TVar1;
  size_type sVar2;
  THint *in_RDX;
  TClusterToLetterMap *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  TClusters *unaff_retaddr;
  TLetter let;
  int i;
  int local_1c;
  
  for (local_1c = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI),
      local_1c < (int)sVar2; local_1c = local_1c + 1) {
    TVar1 = decode(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),in_RSI,in_RDX);
    if ((TVar1 < 1) || (0x1a < TVar1)) {
      if (TVar1 == 0x1b) {
        printf("_");
      }
      else {
        printf(".");
      }
    }
    else {
      printf("%c",(ulong)(TVar1 + 0x60));
    }
  }
  return;
}

Assistant:

void printDecoded(const TClusters & t, const TClusterToLetterMap & clMap, const THint & hint) {
        for (int i = 0; i < (int) t.size(); ++i) {
            const auto let = decode(t, i, clMap, hint);

            if (let >= 1 && let <= 26) {
                printf("%c", 'a' + let - 1);
            } else if (let == 27) {
                printf("_");
            } else {
                printf(".");
            }
        }
    }